

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::UpdateTextureID(ImDrawList *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  ImVec4 *pIVar7;
  ImDrawCmd *__dest;
  long lVar8;
  void *pvVar9;
  int iVar10;
  ImDrawCmd *pIVar11;
  int iVar12;
  undefined1 auVar13 [16];
  
  lVar8 = (long)(this->_TextureIdStack).Size;
  if (lVar8 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = (this->_TextureIdStack).Data[lVar8 + -1];
  }
  uVar6 = (this->CmdBuffer).Size;
  if ((ulong)uVar6 == 0) {
    pIVar11 = (ImDrawCmd *)0x0;
  }
  else {
    if ((int)uVar6 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4ca,"value_type &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar11 = (this->CmdBuffer).Data + ((ulong)uVar6 - 1);
  }
  if ((pIVar11 != (ImDrawCmd *)0x0) &&
     (((pIVar11->ElemCount == 0 || (pIVar11->TextureId == pvVar9)) &&
      (pIVar11->UserCallback == (ImDrawCallback)0x0)))) {
    if (((1 < (int)uVar6) && (pIVar11->ElemCount == 0)) && (pIVar11[-1].TextureId == pvVar9)) {
      lVar8 = (long)(this->_ClipRectStack).Size;
      pIVar7 = (this->_ClipRectStack).Data + lVar8 + -1;
      if (lVar8 == 0) {
        pIVar7 = &this->_Data->ClipRectFullscreen;
      }
      auVar13[0] = -(*(char *)&pIVar7->x == *(char *)&pIVar11[-1].ClipRect.x);
      auVar13[1] = -(*(char *)((long)&pIVar7->x + 1) == *(char *)((long)&pIVar11[-1].ClipRect.x + 1)
                    );
      auVar13[2] = -(*(char *)((long)&pIVar7->x + 2) == *(char *)((long)&pIVar11[-1].ClipRect.x + 2)
                    );
      auVar13[3] = -(*(char *)((long)&pIVar7->x + 3) == *(char *)((long)&pIVar11[-1].ClipRect.x + 3)
                    );
      auVar13[4] = -(*(char *)&pIVar7->y == *(char *)&pIVar11[-1].ClipRect.y);
      auVar13[5] = -(*(char *)((long)&pIVar7->y + 1) == *(char *)((long)&pIVar11[-1].ClipRect.y + 1)
                    );
      auVar13[6] = -(*(char *)((long)&pIVar7->y + 2) == *(char *)((long)&pIVar11[-1].ClipRect.y + 2)
                    );
      auVar13[7] = -(*(char *)((long)&pIVar7->y + 3) == *(char *)((long)&pIVar11[-1].ClipRect.y + 3)
                    );
      auVar13[8] = -(*(char *)&pIVar7->z == *(char *)&pIVar11[-1].ClipRect.z);
      auVar13[9] = -(*(char *)((long)&pIVar7->z + 1) == *(char *)((long)&pIVar11[-1].ClipRect.z + 1)
                    );
      auVar13[10] = -(*(char *)((long)&pIVar7->z + 2) ==
                     *(char *)((long)&pIVar11[-1].ClipRect.z + 2));
      auVar13[0xb] = -(*(char *)((long)&pIVar7->z + 3) ==
                      *(char *)((long)&pIVar11[-1].ClipRect.z + 3));
      auVar13[0xc] = -(*(char *)&pIVar7->w == *(char *)&pIVar11[-1].ClipRect.w);
      auVar13[0xd] = -(*(char *)((long)&pIVar7->w + 1) ==
                      *(char *)((long)&pIVar11[-1].ClipRect.w + 1));
      auVar13[0xe] = -(*(char *)((long)&pIVar7->w + 2) ==
                      *(char *)((long)&pIVar11[-1].ClipRect.w + 2));
      auVar13[0xf] = -(*(char *)((long)&pIVar7->w + 3) ==
                      *(char *)((long)&pIVar11[-1].ClipRect.w + 3));
      if (((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar13[0xf] >> 7) << 0xf) == 0xffff) &&
         (pIVar11[-1].UserCallback == (ImDrawCallback)0x0)) {
        (this->CmdBuffer).Size = uVar6 - 1;
        return;
      }
    }
    pIVar11->TextureId = pvVar9;
    return;
  }
  lVar8 = (long)(this->_ClipRectStack).Size;
  pIVar7 = (this->_ClipRectStack).Data + lVar8 + -1;
  if (lVar8 == 0) {
    pIVar7 = &this->_Data->ClipRectFullscreen;
  }
  fVar1 = pIVar7->x;
  fVar2 = pIVar7->z;
  lVar8 = (long)(this->_TextureIdStack).Size;
  if (lVar8 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = (this->_TextureIdStack).Data[lVar8 + -1];
  }
  if (fVar1 <= fVar2) {
    fVar3 = pIVar7->y;
    fVar4 = pIVar7->w;
    if (fVar3 <= fVar4) {
      iVar12 = (this->CmdBuffer).Size;
      iVar5 = (this->CmdBuffer).Capacity;
      if (iVar12 == iVar5) {
        iVar12 = iVar12 + 1;
        if (iVar5 == 0) {
          iVar10 = 8;
        }
        else {
          iVar10 = iVar5 / 2 + iVar5;
        }
        if (iVar12 < iVar10) {
          iVar12 = iVar10;
        }
        if (iVar5 < iVar12) {
          __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar12 * 0x30);
          pIVar11 = (this->CmdBuffer).Data;
          if (pIVar11 != (ImDrawCmd *)0x0) {
            memcpy(__dest,pIVar11,(long)(this->CmdBuffer).Size * 0x30);
            ImGui::MemFree((this->CmdBuffer).Data);
          }
          (this->CmdBuffer).Data = __dest;
          (this->CmdBuffer).Capacity = iVar12;
        }
      }
      pIVar11 = (this->CmdBuffer).Data;
      iVar12 = (this->CmdBuffer).Size;
      pIVar11[iVar12].ElemCount = 0;
      pIVar11[iVar12].ClipRect.x = fVar1;
      pIVar11[iVar12].ClipRect.y = fVar3;
      pIVar11[iVar12].ClipRect.z = fVar2;
      pIVar11[iVar12].ClipRect.w = fVar4;
      pIVar11[iVar12].TextureId = pvVar9;
      pIVar11[iVar12].UserCallback = (ImDrawCallback)0x0;
      (&pIVar11[iVar12].UserCallback)[1] = (ImDrawCallback)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                ,0x180,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::UpdateTextureID()
{
    // If current command is used with different settings we need to add a new command
    const ImTextureID curr_texture_id = GetCurrentTextureId();
    ImDrawCmd* curr_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != curr_texture_id) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && prev_cmd->TextureId == curr_texture_id && memcmp(&prev_cmd->ClipRect, &GetCurrentClipRect(), sizeof(ImVec4)) == 0 && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->TextureId = curr_texture_id;
}